

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<float,long_double>
                 (float *x,size_t n_,MissingAction missing_action,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  long in_RCX;
  ulong in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __value;
  size_t row;
  longdouble w_this;
  longdouble n_prev;
  longdouble out;
  longdouble n;
  longdouble diff;
  longdouble delta_div;
  longdouble delta_s;
  longdouble delta;
  longdouble M4;
  longdouble M3;
  longdouble M2;
  longdouble m;
  undefined8 local_108;
  undefined1 local_f9;
  undefined8 local_f0;
  undefined8 local_8;
  
  fVar5 = 0.0;
  fVar6 = fVar5;
  fVar7 = fVar5;
  fVar3 = fVar5;
  fVar8 = fVar5;
  fVar2 = fVar5;
  for (local_f0 = 0; local_f0 < in_RSI; local_f0 = local_f0 + 1) {
    uVar10 = std::isnan((double)(ulong)*(uint *)(in_RDI + local_f0 * 4));
    local_f9 = 1;
    in_XMM0_Qa = extraout_XMM0_Qa;
    if ((uVar10 & 1) == 0) {
      iVar11 = std::isinf((double)(ulong)*(uint *)(in_RDI + local_f0 * 4));
      local_f9 = (byte)iVar11;
      in_XMM0_Qa = extraout_XMM0_Qa_00;
    }
    if (((local_f9 ^ 0xff) & 1) != 0) {
      fVar1 = *(float *)(in_RCX + local_f0 * 4);
      fVar2 = fVar2 + fVar1;
      fVar9 = *(float *)(in_RDI + local_f0 * 4) - fVar8;
      fVar4 = fVar9 / fVar2;
      fVar9 = fVar3 * fVar4 * fVar9;
      fVar8 = fVar1 * fVar4 + fVar8;
      fVar6 = fVar1 * (fVar7 * fVar4 * -4.0 +
                      fVar9 * fVar4 * fVar4 * ((fVar2 * fVar2 - fVar2 * 3.0) + 3.0) +
                      fVar5 * fVar4 * fVar4 * 6.0) + fVar6;
      fVar7 = fVar7 + fVar1 * ((fVar2 + -2.0) * fVar9 * fVar4 - fVar5 * fVar4 * 3.0);
      fVar5 = fVar1 * fVar9 + fVar5;
      fVar3 = fVar2;
    }
  }
  if (fVar2 <= 0.0) {
    local_8 = -INFINITY;
  }
  else {
    uVar10 = std::isnan(in_XMM0_Qa);
    if (((uVar10 & 1) == 0) && (uVar10 = std::isinf(__value), (uVar10 & 1) == 0)) {
      local_108 = (double)((fVar2 / fVar5) * (fVar6 / fVar5));
      if (local_108 <= 0.0) {
        local_108 = 0.0;
      }
    }
    else {
      local_108 = -INFINITY;
    }
    local_8 = local_108;
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(real_t *restrict x, size_t n_, MissingAction missing_action, real_t *restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = 0; row < n_; row++)
    {
        if (likely(!is_na_or_inf(x[row])))
        {
            w_this = w[row];
            n += w_this;

            delta      =  x[row] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}